

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoel.cpp
# Opt level: O0

TPZTransform<double> * __thiscall TPZGeoEl::Projection(TPZGeoEl *this,int side)

{
  int iVar1;
  undefined4 in_EDX;
  long *in_RSI;
  TPZTransform<double> *in_RDI;
  TPZTransform<double> tr2;
  TPZTransform<double> tr;
  TPZTransform<double> *tr3;
  TPZTransform<double> *in_stack_fffffffffffffca0;
  TPZTransform<double> *in_stack_fffffffffffffca8;
  undefined1 local_1b8 [420];
  undefined4 local_14;
  
  local_14 = in_EDX;
  iVar1 = (**(code **)(*in_RSI + 0xf0))();
  (**(code **)(*in_RSI + 0x1d8))(local_1b8,in_RSI,iVar1 + -1,local_14);
  iVar1 = (**(code **)(*in_RSI + 0xf0))();
  (**(code **)(*in_RSI + 0x1d8))(&stack0xfffffffffffffca8,in_RSI,local_14,iVar1 + -1);
  TPZTransform<double>::Multiply(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1b395c3);
  TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1b395d0);
  return in_RDI;
}

Assistant:

TPZTransform<> TPZGeoEl::Projection(int side)
{
	TPZTransform<> tr = SideToSideTransform(NSides()-1,side);
	TPZTransform<> tr2 = SideToSideTransform(side,NSides()-1);
	TPZTransform<> tr3 = tr2.Multiply(tr);
	//	std::cout << "interior to side " << side << " trans " << tr << std::endl;
	//	std::cout << "side to interior " << side << " trans " << tr2 << std::endl;
	//	std::cout << "side to side " << side << " trans " << tr3 << std::endl;
	return tr3;
}